

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshareddata.h
# Opt level: O3

int __thiscall
QExplicitlySharedDataPointer<QNetworkRequestFactoryPrivate>::clone
          (QExplicitlySharedDataPointer<QNetworkRequestFactoryPrivate> *this,__fn *__fn,
          void *__child_stack,int __flags,void *__arg,...)

{
  QNetworkRequestFactoryPrivate *pQVar1;
  Data *pDVar2;
  Data *pDVar3;
  Data *pDVar4;
  rep rVar5;
  undefined4 *puVar6;
  
  puVar6 = (undefined4 *)operator_new(0x88);
  pQVar1 = (this->d).ptr;
  *puVar6 = 0;
  QSslConfiguration::QSslConfiguration((QSslConfiguration *)(puVar6 + 2),&pQVar1->sslConfig);
  QUrl::QUrl((QUrl *)(puVar6 + 4),&pQVar1->baseUrl);
  QHttpHeaders::QHttpHeaders((QHttpHeaders *)(puVar6 + 6),&pQVar1->headers);
  pDVar2 = (pQVar1->bearerToken).d.d;
  *(Data **)(puVar6 + 8) = pDVar2;
  *(char **)(puVar6 + 10) = (pQVar1->bearerToken).d.ptr;
  *(qsizetype *)(puVar6 + 0xc) = (pQVar1->bearerToken).d.size;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
    UNLOCK();
  }
  pDVar3 = (pQVar1->userName).d.d;
  *(Data **)(puVar6 + 0xe) = pDVar3;
  *(char16_t **)(puVar6 + 0x10) = (pQVar1->userName).d.ptr;
  *(qsizetype *)(puVar6 + 0x12) = (pQVar1->userName).d.size;
  if (pDVar3 != (Data *)0x0) {
    LOCK();
    (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
    UNLOCK();
  }
  pDVar3 = (pQVar1->password).d.d;
  *(Data **)(puVar6 + 0x14) = pDVar3;
  *(char16_t **)(puVar6 + 0x16) = (pQVar1->password).d.ptr;
  *(qsizetype *)(puVar6 + 0x18) = (pQVar1->password).d.size;
  if (pDVar3 != (Data *)0x0) {
    LOCK();
    (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
    UNLOCK();
  }
  QUrlQuery::QUrlQuery((QUrlQuery *)(puVar6 + 0x1a),&pQVar1->queryParameters);
  rVar5 = (pQVar1->transferTimeout).__r;
  *(undefined8 *)(puVar6 + 0x1c) = *(undefined8 *)&pQVar1->priority;
  *(rep *)(puVar6 + 0x1e) = rVar5;
  pDVar4 = (pQVar1->attributes).d;
  *(Data **)(puVar6 + 0x20) = pDVar4;
  if ((pDVar4 != (Data *)0x0) && ((pDVar4->ref).atomic._q_value.super___atomic_base<int>._M_i != -1)
     ) {
    LOCK();
    (pDVar4->ref).atomic._q_value.super___atomic_base<int>._M_i =
         (pDVar4->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  return (int)puVar6;
}

Assistant:

Q_INLINE_TEMPLATE T *QExplicitlySharedDataPointer<T>::clone()
{
    return new T(*d.get());
}